

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::
Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
::~Stack(Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
         *this)

{
  long in_RDI;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *p;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x10);
  while (local_10 != *(long *)(in_RDI + 8)) {
    local_10 = local_10 + -0x40;
    Inferences::ALASCA::VariableElimination::
    FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>::~FoundVarInLiteral
              ((FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x71359d);
  }
  if (*(long *)(in_RDI + 8) != 0) {
    Lib::free(*(void **)(in_RDI + 8));
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }